

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  mtree *mtree;
  bool bVar2;
  __mode_t p;
  uint uVar3;
  uint uVar4;
  mode_t mVar5;
  int iVar6;
  mtree_entry *pmVar7;
  int *piVar8;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar9;
  archive_string *paVar10;
  size_t sVar11;
  mtree_entry **ppmVar12;
  archive_rb_node *paVar13;
  archive_rb_node *paVar14;
  size_t len;
  mtree_entry *pmVar15;
  long lVar16;
  la_int64_t lVar17;
  char *pcVar18;
  char *pcVar19;
  size_t sVar20;
  mtree_entry *__s_00;
  char *pcVar21;
  ulong uVar22;
  __dev_t _Var23;
  long lVar24;
  char cVar25;
  byte *pbVar26;
  long lVar27;
  undefined1 *puVar28;
  mtree_entry *pmVar29;
  ulong uVar30;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  long local_118;
  archive_entry *local_110;
  uint local_104;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  mtree_entry *local_f0;
  mtree_entry *local_e8;
  archive_rb_tree *local_e0;
  archive_entry *local_d8;
  archive_entry *local_d0;
  mtree_entry **local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      uVar22 = 0xffffffe2;
      goto LAB_003ff40d;
    }
    local_d8 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_110 = (archive_entry *)0x0;
    detect_form(a,(int *)&local_d0);
    local_118 = 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = &mtree->entries;
      local_e0 = &mtree->rbtree;
      local_f8 = (mtree_entry *)0x0;
LAB_003fec50:
      lVar27 = 0;
      uVar30 = 0;
      do {
        _Var23 = local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_003ff3fd;
        pvVar9 = memchr(__s,10,local_c0.st_dev);
        if (pvVar9 != (void *)0x0) {
          _Var23 = (long)pvVar9 + (1 - (long)__s);
          local_c0.st_dev = _Var23;
        }
        if (0xffff < (long)(_Var23 + uVar30)) {
          pcVar18 = "Line too long";
          iVar6 = 0x54;
          goto LAB_003ff3f6;
        }
        paVar10 = archive_string_ensure((archive_string *)mtree,_Var23 + uVar30 + 1);
        if (paVar10 == (archive_string *)0x0) {
          pcVar18 = "Can\'t allocate working buffer";
          iVar6 = 0xc;
          goto LAB_003ff3f6;
        }
        memcpy((mtree->line).s + uVar30,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        _Var23 = local_c0.st_dev;
        uVar22 = local_c0.st_dev + uVar30;
        (mtree->line).s[uVar22] = '\0';
        pmVar7 = (mtree_entry *)(mtree->line).s;
        pbVar26 = (byte *)((long)(pmVar7->rbnode).rb_nodes + lVar27);
LAB_003fecea:
        bVar1 = *pbVar26;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar9 == (void *)0x0) goto LAB_003fed32;
          }
          else {
            if (bVar1 == 0) goto LAB_003fed32;
            if (bVar1 == 10) {
              if (uVar22 == 0) break;
              if (-1 < (long)uVar22) {
                lVar27 = 0;
                pmVar29 = pmVar7;
                goto LAB_003fed7d;
              }
              free_options((mtree_option *)local_110);
              entry = local_d8;
              if ((int)uVar22 != 0) goto LAB_003ff40d;
              goto LAB_003fe7e5;
            }
          }
LAB_003fed20:
          pbVar26 = pbVar26 + 1;
          goto LAB_003fecea;
        }
        if ((bVar1 != 0x5c) || (pbVar26[1] == 0)) goto LAB_003fed20;
        if (pbVar26[1] != 10) {
          pbVar26 = pbVar26 + 1;
          goto LAB_003fed20;
        }
        *(char *)((long)(pmVar7->rbnode).rb_nodes + (uVar22 - 2)) = '\0';
        uVar22 = uVar22 - 2;
        pmVar7 = (mtree_entry *)(mtree->line).s;
LAB_003fed32:
        lVar27 = (long)pbVar26 - (long)pmVar7;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
        uVar30 = uVar22;
      } while (__s != (void *)0x0);
    }
LAB_003ff231:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_110);
    entry = local_d8;
  }
LAB_003fe7e5:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar7 = mtree->this_entry;
  uVar22 = 1;
  if (pmVar7 != (mtree_entry *)0x0) {
    paVar10 = &mtree->current_dir;
    local_100 = (mtree_entry *)&mtree->rbtree;
    do {
      pcVar18 = pmVar7->name;
      if (((*pcVar18 == '.') && (pcVar18[1] == '.')) && (pcVar18[2] == '\0')) {
        pmVar7->used = '\x01';
        sVar20 = (mtree->current_dir).length;
        if (sVar20 != 0) {
          pcVar18 = paVar10->s;
          pcVar19 = pcVar18 + sVar20;
          do {
            pcVar21 = pcVar19;
            pcVar19 = pcVar21 + -1;
            if (pcVar19 < pcVar18) break;
          } while (*pcVar19 != '/');
          pcVar21 = pcVar21 + -2;
          if (pcVar19 < pcVar18) {
            pcVar21 = pcVar19;
          }
          (mtree->current_dir).length = (size_t)(pcVar21 + (1 - (long)pcVar18));
        }
      }
      else if (pmVar7->used == '\0') {
        pmVar7->used = '\x01';
        local_110 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_104 = 0;
        uVar3 = parse_line(a,entry,mtree,pmVar7,(int *)&local_104);
        if (pmVar7->full == '\0') {
          sVar20 = (mtree->current_dir).length;
          if (sVar20 != 0) {
            archive_strcat(paVar10,"/");
          }
          archive_strcat(paVar10,pmVar7->name);
          archive_entry_copy_pathname(entry,paVar10->s);
          mVar5 = archive_entry_filetype(entry);
          if (mVar5 != 0x4000) {
            (mtree->current_dir).length = sVar20;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar7->name);
          for (pmVar7 = (mtree_entry *)
                        __archive_rb_tree_find_node((archive_rb_tree *)local_100,pmVar7->name);
              pmVar7 != (mtree_entry *)0x0; pmVar7 = pmVar7->next_dup) {
            if ((pmVar7->full != '\0') && (pmVar7->used == '\0')) {
              pmVar7->used = '\x01';
              uVar4 = parse_line(a,entry,mtree,pmVar7,(int *)&local_104);
              if ((int)uVar4 < (int)uVar3) {
                uVar3 = uVar4;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_003ff385:
          lVar17 = archive_entry_size(entry);
          mtree->cur_size = lVar17;
          mtree->offset = 0;
        }
        else {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar18 = archive_entry_pathname(entry);
          }
          else {
            pcVar18 = (mtree->contents_name).s;
          }
          mVar5 = archive_entry_filetype(entry);
          if ((mVar5 == 0x8000) || (mVar5 = archive_entry_filetype(entry), mVar5 == 0x4000)) {
            iVar6 = open(pcVar18,0x80000);
            mtree->fd = iVar6;
            __archive_ensure_cloexec_flag(iVar6);
            iVar6 = mtree->fd;
            if (iVar6 == -1) {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar8,"Can\'t open %s",pcVar18);
                uVar3 = 0xffffffec;
              }
              goto LAB_003fe9ed;
            }
          }
          else {
LAB_003fe9ed:
            iVar6 = mtree->fd;
          }
          if (iVar6 < 0) {
            iVar6 = lstat(pcVar18,&local_c0);
            if (iVar6 != -1) goto LAB_003fea46;
LAB_003fea7e:
            if ((local_104 & 0x800) == 0) goto LAB_003ff385;
LAB_003feb9b:
            pmVar7 = mtree->this_entry;
            goto LAB_003feba4;
          }
          iVar6 = fstat(iVar6,&local_c0);
          if (iVar6 == -1) {
            piVar8 = __errno_location();
            archive_set_error(&a->archive,*piVar8,"Could not fstat %s",pcVar18);
            close(mtree->fd);
            mtree->fd = -1;
            uVar3 = 0xffffffec;
            goto LAB_003fea7e;
          }
LAB_003fea46:
          p = local_c0.st_mode;
          uVar4 = local_c0.st_mode & 0xf000;
          if (uVar4 == 0xa000) {
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 != 0xa000) goto LAB_003feae9;
LAB_003ff252:
            uVar4 = local_104;
            if (((local_104 & 0x1001) != 1) &&
               ((mVar5 = archive_entry_filetype(entry), mVar5 == 0x2000 ||
                (mVar5 = archive_entry_filetype(entry), mVar5 == 0x6000)))) {
              archive_entry_set_rdev(entry,local_c0.st_rdev);
            }
            if ((uVar4 & 0xc) == 0 || (uVar4 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
            }
            if ((uVar4 & 0x600) == 0 || (uVar4 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
            }
            if ((uVar4 & 0x1010) != 0x10) {
              archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((uVar4 & 0x1020) != 0x20) {
              archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
            }
            if ((uVar4 & 0x1040) != 0x40) {
              archive_entry_set_perm(entry,p);
            }
            if ((uVar4 & 0x1080) != 0x80) {
              archive_entry_set_size(entry,local_c0.st_size);
            }
            archive_entry_set_ino(entry,local_c0.st_ino);
            archive_entry_set_dev(entry,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_110,&local_d0);
            entry = local_110;
            goto LAB_003ff385;
          }
          if ((uVar4 == 0x8000) && (mVar5 = archive_entry_filetype(entry), mVar5 == 0x8000))
          goto LAB_003ff252;
LAB_003feae9:
          if (((~p & 0xc000) == 0) && (mVar5 = archive_entry_filetype(entry), mVar5 == 0xc000))
          goto LAB_003ff252;
          switch(uVar4 - 0x1000 >> 0xc) {
          case 0:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x1000) goto LAB_003ff252;
            break;
          case 1:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x2000) goto LAB_003ff252;
            break;
          case 3:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x4000) goto LAB_003ff252;
            break;
          case 5:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x6000) goto LAB_003ff252;
          }
          if (-1 < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = -1;
          if ((local_104 & 0x800) != 0) goto LAB_003feb9b;
          if (uVar3 == 0) {
            pcVar18 = archive_entry_pathname(entry);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar18
                             );
            uVar3 = 0xffffffec;
          }
        }
        uVar22 = (ulong)uVar3;
        break;
      }
LAB_003feba4:
      uVar22 = 1;
      pmVar7 = pmVar7->next;
      mtree->this_entry = pmVar7;
    } while (pmVar7 != (mtree_entry *)0x0);
  }
LAB_003ff40d:
  return (int)uVar22;
LAB_003fed7d:
  pmVar29 = (mtree_entry *)((long)(pmVar29->rbnode).rb_nodes + 1);
  uVar22 = (ulong)*(byte *)((long)(pmVar7->rbnode).rb_nodes + lVar27);
  if (0x2f < uVar22) goto LAB_003fef27;
  if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_003fedb0;
    if (uVar22 == 0x2f) {
      uVar22 = (local_c0.st_dev + uVar30) - lVar27;
      if (4 < (long)uVar22) {
        pcVar18 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar27);
        iVar6 = strncmp(pcVar18,"/set",4);
        if (iVar6 == 0) {
          cVar25 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 4);
          if ((cVar25 == ' ') || (cVar25 == '\t')) {
            pcVar18 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 4);
            goto LAB_003ff00a;
          }
        }
        else if (((6 < uVar22) && (iVar6 = strncmp(pcVar18,"/unset",6), iVar6 == 0)) &&
                ((cVar25 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 6), cVar25 == ' ' ||
                 (cVar25 == '\t')))) {
          pcVar19 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 6);
          pcVar18 = strchr(pcVar19,0x3d);
          if (pcVar18 != (char *)0x0) {
            pcVar18 = "/unset shall not contain `=\'";
            iVar6 = -1;
            goto LAB_003ff3f6;
          }
          sVar11 = strspn(pcVar19," \t\r\n");
          cVar25 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 6 + sVar11);
          if (cVar25 == '\0') goto LAB_003fedb0;
          pcVar18 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + sVar11 + 6);
          goto LAB_003feeaa;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_118);
      goto LAB_003ff3fd;
    }
    goto LAB_003fef27;
  }
  lVar27 = lVar27 + 1;
  goto LAB_003fed7d;
LAB_003ff00a:
  sVar11 = strspn(pcVar18," \t\r\n");
  if (pcVar18[sVar11] == '\0') goto LAB_003fedb0;
  pcVar21 = pcVar18 + sVar11;
  sVar11 = strcspn(pcVar21," \t\r\n");
  pcVar18 = pcVar21 + sVar11;
  pcVar19 = strchr(pcVar21,0x3d);
  sVar20 = (long)pcVar19 - (long)pcVar21;
  if (pcVar18 < pcVar19) {
    sVar20 = sVar11;
  }
  remove_option((mtree_option **)&local_110,pcVar21,sVar20);
  uVar3 = add_option(a,(mtree_option **)&local_110,pcVar21,sVar11);
  if (uVar3 != 0) goto LAB_003ff3cd;
  goto LAB_003ff00a;
LAB_003feeaa:
  do {
    sVar11 = strcspn(pcVar18," \t\r\n");
    sVar20 = sVar11;
    if (sVar11 == 3) {
      if (((cVar25 != 'a') || (pcVar18[1] != 'l')) || (pcVar18[2] != 'l')) {
        sVar20 = 3;
        goto LAB_003fef03;
      }
      free_options((mtree_option *)local_110);
      local_110 = (archive_entry *)0x0;
    }
    else {
LAB_003fef03:
      remove_option((mtree_option **)&local_110,pcVar18,sVar20);
    }
    pcVar18 = pcVar18 + sVar11;
    sVar11 = strspn(pcVar18," \t\r\n");
    cVar25 = pcVar18[sVar11];
    pcVar18 = pcVar18 + sVar11;
  } while (cVar25 != '\0');
  goto LAB_003fedb0;
LAB_003fef27:
  local_f0 = (mtree_entry *)CONCAT44(local_f0._4_4_,(uint32_t)local_d0);
  local_100 = (mtree_entry *)malloc(0x40);
  if (local_100 != (mtree_entry *)0x0) {
    __s_00 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + lVar27);
    lVar24 = (_Var23 + uVar30) - lVar27;
    *(undefined8 *)((long)&local_100->options + 2) = 0;
    *(undefined8 *)((long)&local_100->name + 2) = 0;
    local_100->next = (mtree_entry *)0x0;
    local_100->options = (mtree_option *)0x0;
    ppmVar12 = &local_f8->next;
    if (local_f8 == (mtree_entry *)0x0) {
      ppmVar12 = local_c8;
    }
    *ppmVar12 = local_100;
    local_e8 = local_100;
    if ((int)local_f0 != 0) {
      pmVar15 = __s_00;
      if (0 < lVar24) {
        pbVar26 = (byte *)((long)(pmVar7->rbnode).rb_nodes + _Var23 + uVar30);
LAB_003fefa5:
        pbVar26 = pbVar26 + -1;
        if (((ulong)*pbVar26 < 0x21) && ((0x100002600U >> ((ulong)*pbVar26 & 0x3f) & 1) != 0))
        goto code_r0x003fefbc;
        lVar16 = 0;
        do {
          if (((ulong)(byte)pmVar29[-1].field_0x3f < 0x21) &&
             ((0x100002600U >> ((ulong)(byte)pmVar29[-1].field_0x3f & 0x3f) & 1) != 0)) {
            pmVar15 = pmVar29;
          }
          lVar16 = lVar16 + 1;
          pmVar29 = (mtree_entry *)((long)(pmVar29->rbnode).rb_nodes + 1);
        } while (lVar24 != lVar16);
      }
      goto LAB_003fefd2;
    }
    local_f0 = __s_00;
    pcVar18 = (char *)strcspn((char *)__s_00," \t\r\n");
    __s_00 = (mtree_entry *)(pcVar18 + (long)((long)(pmVar7->rbnode).rb_nodes + lVar27));
    pmVar15 = (mtree_entry *)(lVar24 + (long)__s_00);
    goto LAB_003ff09e;
  }
  goto LAB_003ff45d;
code_r0x003fefbc:
  bVar2 = lVar24 < 2;
  lVar24 = lVar24 + -1;
  if (bVar2) goto code_r0x003fefcc;
  goto LAB_003fefa5;
code_r0x003fefcc:
  lVar24 = 0;
LAB_003fefd2:
  pcVar18 = (char *)((long)pmVar7 + lVar27 + (lVar24 - (long)pmVar15));
  local_f0 = pmVar15;
LAB_003ff09e:
  pmVar7 = local_e8;
  pcVar19 = (char *)malloc((size_t)(pcVar18 + 1));
  pmVar7->name = pcVar19;
  if (pcVar19 != (char *)0x0) {
    local_f8 = pmVar15;
    memcpy(pcVar19,local_f0,(size_t)pcVar18);
    pcVar19[(long)pcVar18] = '\0';
    parse_escapes(pcVar19,pmVar7);
    pmVar29 = local_100;
    pmVar7->next_dup = (mtree_entry *)0x0;
    if ((pmVar7->full != '\0') &&
       (iVar6 = __archive_rb_tree_insert_node(local_e0,&pmVar7->rbnode), iVar6 == 0)) {
      paVar13 = __archive_rb_tree_find_node(local_e0,pmVar7->name);
      do {
        paVar14 = paVar13;
        paVar13 = paVar14[1].rb_nodes[0];
      } while (paVar13 != (archive_rb_node *)0x0);
      paVar14[1].rb_nodes[0] = &pmVar7->rbnode;
    }
    puVar28 = (undefined1 *)&local_110;
    while (puVar28 = *(undefined1 **)puVar28, pmVar7 = (mtree_entry *)&pmVar29->options,
          puVar28 != (undefined1 *)0x0) {
      pcVar18 = *(char **)((long)puVar28 + 8);
      sVar11 = strlen(pcVar18);
      uVar3 = add_option(a,&pmVar29->options,pcVar18,sVar11);
      if (uVar3 != 0) goto LAB_003ff3cd;
    }
    while ((local_100 = pmVar7, sVar11 = strspn((char *)__s_00," \t\r\n"),
           *(char *)((long)(__s_00->rbnode).rb_nodes + sVar11) != '\0' &&
           (pmVar7 = (mtree_entry *)((long)(__s_00->rbnode).rb_nodes + sVar11), pmVar7 < local_f8)))
    {
      len = strcspn((char *)pmVar7," \t\r\n");
      __s_00 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + len);
      pmVar15 = (mtree_entry *)strchr((char *)pmVar7,0x3d);
      pmVar29 = local_100;
      sVar11 = (long)pmVar15 - (long)pmVar7;
      if (__s_00 < pmVar15) {
        sVar11 = len;
      }
      if (pmVar15 == (mtree_entry *)0x0) {
        sVar11 = len;
      }
      remove_option((mtree_option **)local_100,(char *)pmVar7,sVar11);
      uVar3 = add_option(a,(mtree_option **)pmVar29,(char *)pmVar7,len);
      pmVar7 = local_100;
      if (uVar3 != 0) goto LAB_003ff3cd;
    }
    local_f8 = local_e8;
LAB_003fedb0:
    local_118 = local_118 + 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) goto LAB_003ff231;
    goto LAB_003fec50;
  }
LAB_003ff45d:
  piVar8 = __errno_location();
  iVar6 = *piVar8;
  pcVar18 = "Can\'t allocate memory";
LAB_003ff3f6:
  archive_set_error(&a->archive,iVar6,pcVar18);
LAB_003ff3fd:
  uVar22 = 0xffffffe2;
LAB_003ff403:
  free_options((mtree_option *)local_110);
  goto LAB_003ff40d;
LAB_003ff3cd:
  uVar22 = (ulong)uVar3;
  goto LAB_003ff403;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      /*
       * Do not increment filename_size here as the computations below
       * add the space for the terminating NUL explicitly.
       */
      filename[filename_size] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}